

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall
OpticsParser::Parser::parseHeaderLine(Parser *this,string *line,ProductData *product)

{
  ProductData *pPVar1;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ProductData *local_20;
  ProductData *product_local;
  string *line_local;
  Parser *this_local;
  
  local_20 = product;
  product_local = (ProductData *)line;
  line_local = (string *)this;
  parseUnits(this,line,product);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Thickness",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"}",&local_79);
  parsePropertyAtTheEnd<std::optional<double>>
            (this,&local_40,&local_78,(string *)product_local,&local_20->thickness);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"Conductivity",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"}",&local_c9);
  parsePropertyAtTheEnd<std::optional<double>>
            (this,&local_a0,&local_c8,(string *)product_local,&local_20->conductivity);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"IR Transmittance",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"TIR=",&local_119);
  parsePropertyAtTheEnd<std::optional<double>>
            (this,&local_f0,&local_118,(string *)product_local,&local_20->IRTransmittance);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  parseEmissivities(this,(string *)product_local,local_20);
  pPVar1 = product_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"Product Name",&local_141)
  ;
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,(string *)pPVar1,&local_140,&local_20->productName);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_20->productType,"glazing");
  pPVar1 = product_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"Type",&local_169);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,(string *)pPVar1,&local_168,&local_20->productSubtype);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  pPVar1 = product_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"Ef_Source",&local_191);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,(string *)pPVar1,&local_190,&local_20->frontEmissivitySource);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  pPVar1 = product_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"Eb_Source",&local_1b9);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,(string *)pPVar1,&local_1b8,&local_20->backEmissivitySource);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  pPVar1 = product_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"Manufacturer",&local_1e1)
  ;
  parseStringPropertyInsideBraces<std::__cxx11::string>
            (this,(string *)pPVar1,&local_1e0,&local_20->manufacturer);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  pPVar1 = product_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"Material",&local_209);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,(string *)pPVar1,&local_208,&local_20->material);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  pPVar1 = product_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"Coating Name",&local_231)
  ;
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,(string *)pPVar1,&local_230,&local_20->coatingName);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  pPVar1 = product_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"Coated Side",&local_259);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,(string *)pPVar1,&local_258,&local_20->coatedSide);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  pPVar1 = product_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"Substrate Filename",&local_281);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,(string *)pPVar1,&local_280,&local_20->substrateFilename);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  pPVar1 = product_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"Appearance",&local_2a9);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,(string *)pPVar1,&local_2a8,&local_20->appearance);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  pPVar1 = product_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"Acceptance",&local_2d1);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,(string *)pPVar1,&local_2d0,&local_20->acceptance);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  pPVar1 = product_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,"Extrapolation",&local_2f9);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,(string *)pPVar1,&local_2f8,&local_20->extrapolation);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  pPVar1 = product_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"Specularity",&local_321);
  parseBoolPropertyInsideBraces(this,(string *)pPVar1,&local_320,&local_20->specularity);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  pPVar1 = product_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"Permeability Factor",&local_349);
  parseDoublePropertyInsideBraces(this,(string *)pPVar1,&local_348,&local_20->permeabilityFactor);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  parseNFRCID(this,(string *)product_local,local_20);
  parseAERCID(this,(string *)product_local,local_20);
  return;
}

Assistant:

void Parser::parseHeaderLine(const std::string & line, ProductData & product)
    {
        parseUnits(line, product);
        parsePropertyAtTheEnd("Thickness", "}", line, product.thickness);
        parsePropertyAtTheEnd("Conductivity", "}", line, product.conductivity);
        parsePropertyAtTheEnd("IR Transmittance", "TIR=", line, product.IRTransmittance);
        parseEmissivities(line, product);
        parseStringPropertyInsideBraces(line, "Product Name", product.productName);
        product.productType = "glazing";   // There are only glazing optics files.
        parseStringPropertyInsideBraces(line, "Type", product.productSubtype);
        parseStringPropertyInsideBraces(line, "Ef_Source", product.frontEmissivitySource);
        parseStringPropertyInsideBraces(line, "Eb_Source", product.backEmissivitySource);
        parseStringPropertyInsideBraces(line, "Manufacturer", product.manufacturer);
        parseStringPropertyInsideBraces(line, "Material", product.material);
        parseStringPropertyInsideBraces(line, "Coating Name", product.coatingName);
        parseStringPropertyInsideBraces(line, "Coated Side", product.coatedSide);
        parseStringPropertyInsideBraces(line, "Substrate Filename", product.substrateFilename);
        parseStringPropertyInsideBraces(line, "Appearance", product.appearance);
        parseStringPropertyInsideBraces(line, "Acceptance", product.acceptance);
        parseStringPropertyInsideBraces(line, "Extrapolation", product.extrapolation);
        parseBoolPropertyInsideBraces(line, "Specularity", product.specularity);
        parseDoublePropertyInsideBraces(line, "Permeability Factor", product.permeabilityFactor);
        parseNFRCID(line, product);
        parseAERCID(line, product);
    }